

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  pthread_mutex_t *ppVar1;
  pthread_mutex_t *ppVar2;
  long lVar3;
  _func_int **pp_Var4;
  pthread_mutex_t *ppVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  _func_int **pp_Var9;
  MemTable *b;
  char *pcVar10;
  long in_RCX;
  bool bVar11;
  Writer *last_writer;
  Writer w;
  undefined1 local_b8 [32];
  WriteBatch *local_98;
  undefined1 local_90 [8];
  char *local_88;
  uint32_t auStack_80 [2];
  undefined2 local_78;
  condition_variable local_70 [48];
  pthread_mutex_t *local_40;
  
  __mutex = (pthread_mutex_t *)(options + 0x8c8);
  local_88 = (char *)0x0;
  auStack_80[0] = 0;
  auStack_80[1] = 0;
  local_78 = 0;
  std::condition_variable::condition_variable(local_70);
  local_78 = (ushort)*(byte *)&(updates->rep_)._M_dataplus._M_p;
  local_98 = updates;
  local_40 = __mutex;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 == 0) {
    ppVar1 = (pthread_mutex_t *)(local_90 + 8);
    local_b8._0_8_ = ppVar1;
    std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
    emplace_back<leveldb::DBImpl::Writer*>
              ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
               (options + 0x968),(Writer **)local_b8);
    if (local_78._1_1_ == '\0') {
      ppVar2 = (pthread_mutex_t *)**(undefined8 **)(options + 0x978);
      ppVar5 = (pthread_mutex_t *)local_b8._0_8_;
      local_b8._0_8_ = local_40;
      while (local_40 = (pthread_mutex_t *)local_b8._0_8_, ppVar1 != ppVar2) {
        local_b8._9_7_ = (undefined7)((ulong)local_b8._8_8_ >> 8);
        local_b8[8] = 1;
        std::condition_variable::wait((unique_lock *)local_70);
        if (local_78._1_1_ != '\0') goto LAB_0010d0f7;
        ppVar5 = (pthread_mutex_t *)local_b8._0_8_;
        local_b8._0_8_ = local_40;
        ppVar2 = (pthread_mutex_t *)**(undefined8 **)(options + 0x978);
      }
      local_b8._0_8_ = ppVar5;
      MakeRoomForWrite(this,SUB81(options,0));
      lVar3 = *(long *)(*(long *)(options + 0xa20) + 0x58);
      local_b8._24_8_ = ppVar1;
      if (in_RCX != 0 && (this->super_DB)._vptr_DB == (_func_int **)0x0) {
        b = (MemTable *)BuildBatchGroup((DBImpl *)options,(Writer **)(local_b8 + 0x18));
        WriteBatchInternal::SetSequence((WriteBatch *)b,lVar3 + 1);
        iVar8 = WriteBatchInternal::Count((WriteBatch *)b);
        pthread_mutex_unlock(__mutex);
        local_b8._0_8_ = (((string *)&b->comparator_)->_M_dataplus)._M_p;
        local_b8._8_8_ = ((string *)&b->comparator_)->_M_string_length;
        local_b8._16_8_ = b;
        log::Writer::AddRecord((Writer *)local_90,*(Slice **)(options + 0x958));
        (this->super_DB)._vptr_DB = (_func_int **)local_90;
        if ((local_90 == (undefined1  [8])0x0) &&
           (*(char *)&(local_98->rep_)._M_dataplus._M_p == '\x01')) {
          (**(code **)(**(long **)(options + 0x948) + 0x28))(local_b8);
          (this->super_DB)._vptr_DB = (_func_int **)local_b8._0_8_;
          bVar11 = (pthread_mutex_t *)local_b8._0_8_ != (pthread_mutex_t *)0x0;
        }
        else {
          bVar11 = false;
        }
        if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
          WriteBatchInternal::InsertInto((WriteBatch *)local_b8,(MemTable *)local_b8._16_8_);
          (this->super_DB)._vptr_DB = (_func_int **)local_b8._0_8_;
        }
        iVar7 = pthread_mutex_lock(__mutex);
        if (iVar7 != 0) goto LAB_0010d319;
        if (bVar11) {
          RecordBackgroundError((DBImpl *)options,(Status *)this);
        }
        if ((MemTable *)local_b8._16_8_ == *(MemTable **)(options + 0x9b8)) {
          WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x9b8));
        }
        *(long *)(*(long *)(options + 0xa20) + 0x58) = lVar3 + iVar8;
      }
      uVar6 = local_b8._24_8_;
      pp_Var9 = (this->super_DB)._vptr_DB;
      do {
        ppVar2 = (pthread_mutex_t *)**(undefined8 **)(options + 0x978);
        std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                  ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                   (options + 0x968));
        if (ppVar2 != ppVar1) {
          pp_Var4 = (_func_int **)ppVar2->__align;
          if (pp_Var4 != pp_Var9) {
            if (pp_Var4 != (_func_int **)0x0) {
              operator_delete__(pp_Var4);
            }
            if (pp_Var9 == (_func_int **)0x0) {
              pcVar10 = (char *)0x0;
            }
            else {
              pcVar10 = Status::CopyState((char *)pp_Var9);
            }
            ppVar2->__align = (long)pcVar10;
          }
          ppVar2->__size[0x11] = '\x01';
          std::condition_variable::notify_one();
        }
      } while (ppVar2 != (pthread_mutex_t *)uVar6);
      if (*(long *)(options + 0x998) != *(long *)(options + 0x978)) {
        std::condition_variable::notify_one();
      }
    }
    else {
LAB_0010d0f7:
      if (local_88 == (char *)0x0) {
        pp_Var9 = (_func_int **)0x0;
      }
      else {
        pp_Var9 = (_func_int **)Status::CopyState(local_88);
      }
      (this->super_DB)._vptr_DB = pp_Var9;
    }
    pthread_mutex_unlock(__mutex);
    std::condition_variable::~condition_variable(local_70);
    if (local_88 != (char *)0x0) {
      operator_delete__(local_88);
    }
    return (Status)(char *)this;
  }
LAB_0010d319:
  std::__throw_system_error(iVar7);
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}